

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O0

bool bssl::der::anon_unknown_3::DecimalStringToUint<unsigned_short>
               (ByteReader *in,size_t digits,unsigned_short *out)

{
  bool bVar1;
  byte local_39;
  unsigned_short *puStack_38;
  uint8_t digit;
  size_t i;
  unsigned_short *puStack_28;
  unsigned_short value;
  unsigned_short *out_local;
  size_t digits_local;
  ByteReader *in_local;
  
  i._6_2_ = 0;
  puStack_38 = (unsigned_short *)0x0;
  puStack_28 = out;
  out_local = (unsigned_short *)digits;
  digits_local = (size_t)in;
  while( true ) {
    if (out_local <= puStack_38) {
      *puStack_28 = i._6_2_;
      return true;
    }
    bVar1 = ByteReader::ReadByte((ByteReader *)digits_local,&local_39);
    if (!bVar1) break;
    if ((local_39 < 0x30) || (0x39 < local_39)) {
      return false;
    }
    i._6_2_ = i._6_2_ * 10 + (local_39 - 0x30);
    puStack_38 = (unsigned_short *)((long)puStack_38 + 1);
  }
  return false;
}

Assistant:

bool DecimalStringToUint(ByteReader &in, size_t digits, UINT *out) {
  UINT value = 0;
  for (size_t i = 0; i < digits; ++i) {
    uint8_t digit;
    if (!in.ReadByte(&digit)) {
      return false;
    }
    if (digit < '0' || digit > '9') {
      return false;
    }
    value = (value * 10) + (digit - '0');
  }
  *out = value;
  return true;
}